

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressStream2_simpleArgs
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,size_t *dstPos,void *src,
                 size_t srcSize,size_t *srcPos,ZSTD_EndDirective endOp)

{
  size_t sVar1;
  ZSTD_outBuffer output;
  ZSTD_inBuffer local_50;
  ZSTD_outBuffer local_38;
  
  local_38.pos = *dstPos;
  local_50.pos = *srcPos;
  local_50.src = src;
  local_50.size = srcSize;
  local_38.dst = dst;
  local_38.size = dstCapacity;
  sVar1 = ZSTD_compressStream2(cctx,&local_38,&local_50,endOp);
  *dstPos = local_38.pos;
  *srcPos = local_50.pos;
  return sVar1;
}

Assistant:

size_t ZSTD_compressStream2_simpleArgs (
                            ZSTD_CCtx* cctx,
                            void* dst, size_t dstCapacity, size_t* dstPos,
                      const void* src, size_t srcSize, size_t* srcPos,
                            ZSTD_EndDirective endOp)
{
    ZSTD_outBuffer output = { dst, dstCapacity, *dstPos };
    ZSTD_inBuffer  input  = { src, srcSize, *srcPos };
    /* ZSTD_compressStream2() will check validity of dstPos and srcPos */
    size_t const cErr = ZSTD_compressStream2(cctx, &output, &input, endOp);
    *dstPos = output.pos;
    *srcPos = input.pos;
    return cErr;
}